

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

CheckedError __thiscall flatbuffers::Parser::ParseDecl(Parser *this,char *filename)

{
  SymbolTable<flatbuffers::Value> *this_00;
  _Rb_tree_header *p_Var1;
  pointer ppFVar2;
  FieldDef *pFVar3;
  undefined8 struct_def_00;
  int iVar4;
  int iVar5;
  const_iterator cVar6;
  size_t sVar7;
  pointer ppFVar8;
  Type *e;
  long *plVar9;
  ulong uVar10;
  long lVar11;
  size_type *psVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  char *in_RDX;
  undefined8 extraout_RDX;
  __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  __last;
  ulong uVar14;
  iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  StructDef *name_00;
  bool bVar15;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar16;
  string qualified_name;
  voffset_t id;
  string name;
  StructDef *struct_def;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dc;
  string local_158;
  unsigned_short local_132;
  string local_130;
  FieldDef *local_110;
  long local_108;
  StructDef *local_100 [2];
  undefined1 local_f0 [80];
  pointer local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(filename + 0x48));
  if (*(int *)(filename + 0x1c) == 0x104) {
    iVar4 = std::__cxx11::string::compare(filename + 0x28);
    if (iVar4 == 0) {
      bVar15 = true;
    }
    else {
      if ((*(int *)(filename + 0x1c) != 0x104) ||
         (iVar5 = std::__cxx11::string::compare(filename + 0x28), iVar5 != 0)) goto LAB_0011799f;
      bVar15 = false;
    }
    Next(this);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_001179e7;
    local_100[0] = (StructDef *)local_f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_100,*(long *)(filename + 0x28),
               *(long *)(filename + 0x30) + *(long *)(filename + 0x28));
    iVar5 = (int)filename;
    Expect(this,iVar5);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
      StartStruct(this,(string *)filename,local_100);
      name_00 = (StructDef *)local_f0._64_8_;
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&((Definition *)local_f0._64_8_)->doc_comment,&local_48);
        *(bool *)((long)name_00 + 0x110) = bVar15;
        if ((in_RDX != (char *)0x0) && (*(long *)(filename + 0x628) != 0)) {
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          strlen(in_RDX);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_130);
          FilePath(&local_158,(string *)(filename + 0x620),&local_130,(bool)filename[0x4e4]);
          pVar16 = std::
                   _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                   ::_M_insert_unique<std::__cxx11::string_const&>
                             ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                               *)(filename + 0x748),&local_158);
          (name_00->super_Definition).declaration_file =
               (string *)(pVar16.first._M_node._M_node + 1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
        }
        this_00 = &(name_00->super_Definition).attributes;
        ParseMetaData(this,(SymbolTable<flatbuffers::Value> *)filename);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"original_order","");
          cVar6 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                          *)this_00,&local_158);
          p_Var1 = &(name_00->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)cVar6._M_node == p_Var1) {
            bVar15 = true;
          }
          else {
            bVar15 = *(long *)(cVar6._M_node + 2) == 0;
          }
          *(char *)((long)name_00 + 0x112) = iVar4 != 0 & bVar15;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          Expect(this,iVar5);
LAB_00117bf1:
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
            if (*(int *)(filename + 0x1c) != 0x7d) goto LAB_00117c05;
            if (iVar4 == 0) {
              local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"force_align","")
              ;
              cVar6 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                      ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                              *)this_00,&local_158);
              if ((_Rb_tree_header *)cVar6._M_node == p_Var1) {
                lVar11 = 0;
              }
              else {
                lVar11 = *(long *)(cVar6._M_node + 2);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158._M_dataplus._M_p != &local_158.field_2) {
                operator_delete(local_158._M_dataplus._M_p,
                                local_158.field_2._M_allocated_capacity + 1);
              }
              if (lVar11 != 0) {
                ParseAlignAttribute(this,(string *)filename,lVar11 + 0x20,
                                    *(size_t **)((long)name_00 + 0x118));
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00117b61;
                *(pointer *)(local_f0._64_8_ + 0x118) = local_158._M_dataplus._M_p;
                name_00 = (StructDef *)local_f0._64_8_;
              }
              sVar7 = name_00->bytesize;
              if (sVar7 == 0) {
                local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_158,"size 0 structs not allowed","");
                Error(this,(string *)filename);
                goto LAB_0011816f;
              }
            }
            else {
              sVar7 = *(size_t *)((long)name_00 + 0x120);
            }
            uVar10 = name_00->minalign - 1 & -sVar7;
            name_00->bytesize = sVar7 + uVar10;
            local_f0._16_8_ = &(name_00->fields).vec;
            ppFVar8 = (name_00->fields).vec.
                      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppFVar2 = (name_00->fields).vec.
                      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            local_f0._24_8_ = name_00;
            if ((ppFVar2 == ppFVar8) || (ppFVar2[-1]->padding = uVar10, iVar4 == 0))
            goto LAB_00117f18;
            __last._M_current =
                 (name_00->fields).vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (ppFVar8 == __last._M_current) goto LAB_00117dce;
            lVar11 = 0;
            do {
              pFVar3 = *ppFVar8;
              local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
              local_108 = lVar11;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"id","");
              cVar6 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                      ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                              *)&(pFVar3->super_Definition).attributes,&local_158);
              name_00 = (StructDef *)local_f0._24_8_;
              if ((_Rb_tree_header *)cVar6._M_node ==
                  &(pFVar3->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) {
                uVar10 = 0;
              }
              else {
                uVar10 = (ulong)(*(long *)(cVar6._M_node + 2) != 0);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158._M_dataplus._M_p != &local_158.field_2) {
                operator_delete(local_158._M_dataplus._M_p,
                                local_158.field_2._M_allocated_capacity + 1);
              }
              lVar11 = local_108 + uVar10;
              ppFVar8 = ppFVar8 + 1;
              __last._M_current = *(pointer *)((long)name_00 + 0x100);
            } while (ppFVar8 != __last._M_current);
            if (lVar11 == 0) {
LAB_00117dce:
              if (filename[0x67c] == '\x01') {
                lVar11 = 0;
                goto LAB_00117dde;
              }
LAB_00117f18:
              struct_def_00 = local_f0._16_8_;
              CheckClash(this,(vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                               *)filename,(StructDef *)local_f0._16_8_,(char *)name_00,0x151ea0);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                CheckClash(this,(vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                                 *)filename,(StructDef *)struct_def_00,(char *)name_00,0x1510f5);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                  CheckClash(this,(vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                                   *)filename,(StructDef *)struct_def_00,(char *)name_00,0x1510fa);
                  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                  if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                    CheckClash(this,(vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                                     *)filename,(StructDef *)struct_def_00,(char *)name_00,0x153094)
                    ;
                    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                    if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                      CheckClash(this,(vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                                       *)filename,(StructDef *)struct_def_00,(char *)name_00,
                                 0x151102);
                      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                      if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                        CheckClash(this,(vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                                         *)filename,(StructDef *)struct_def_00,(char *)name_00,
                                   0x15110f);
                        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                        if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                          Expect(this,iVar5);
                          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                          if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                            Namespace::GetFullyQualifiedName
                                      (&local_158,*(Namespace **)(filename + 0x198),
                                       (string *)name_00,1000);
                            e = (Type *)operator_new(0x20);
                            e->base_type = BASE_TYPE_STRUCT;
                            e->element = BASE_TYPE_NONE;
                            e->struct_def = (StructDef *)local_f0._24_8_;
                            e->enum_def = (EnumDef *)0x0;
                            e->fixed_length = 0;
                            bVar15 = SymbolTable<flatbuffers::Type>::Add
                                               ((SymbolTable<flatbuffers::Type> *)(filename + 0x60),
                                                &local_158,e);
                            if (bVar15) {
                              std::operator+(&local_130,"datatype already exists: ",&local_158);
                              Error(this,(string *)filename);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_130._M_dataplus._M_p != &local_130.field_2) {
                                operator_delete(local_130._M_dataplus._M_p,
                                                local_130.field_2._M_allocated_capacity + 1);
                              }
                            }
                            else {
                              *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
                            }
                            goto LAB_0011816f;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            else {
LAB_00117dde:
              if (lVar11 == (long)__last._M_current - (long)*(FieldDef ***)local_f0._16_8_ >> 3) {
                std::
                sort<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef**,std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>>,bool(*)(flatbuffers::FieldDef_const*,flatbuffers::FieldDef_const*)>
                          ((__normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                            )*(FieldDef ***)local_f0._16_8_,__last,anon_unknown_0::compareFieldDefs)
                ;
                ppFVar8 = (name_00->fields).vec.
                          super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                uVar10 = (long)(name_00->fields).vec.
                               super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar8;
                if (0x7fff8 < uVar10) {
                  __assert_fail("fields.size() <= flatbuffers::numeric_limits<voffset_t>::max()",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                                ,0xaf8,"CheckedError flatbuffers::Parser::ParseDecl(const char *)");
                }
                if (uVar10 < 8) goto LAB_00117f18;
                uVar10 = CONCAT62((int6)((ulong)extraout_RDX >> 0x10),4);
                uVar14 = 0;
                while( true ) {
                  local_108 = CONCAT44(local_108._4_4_,(int)uVar10);
                  pFVar3 = ppFVar8[uVar14];
                  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"id","");
                  cVar6 = std::
                          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                                  *)&(pFVar3->super_Definition).attributes,&local_158);
                  if (cVar6._M_node ==
                      (_Base_ptr)((long)&(pFVar3->super_Definition).attributes.dict + 8U)) {
                    lVar11 = 0;
                  }
                  else {
                    lVar11 = *(long *)(cVar6._M_node + 2);
                  }
                  local_110 = pFVar3;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_158._M_dataplus._M_p != &local_158.field_2) {
                    operator_delete(local_158._M_dataplus._M_p,
                                    local_158.field_2._M_allocated_capacity + 1);
                  }
                  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (lVar11 + 0x20);
                  local_132 = 0;
                  anon_unknown_0::atot<unsigned_short>
                            ((anon_unknown_0 *)&local_158,(__rhs->_M_dataplus)._M_p,
                             (Parser *)filename,&local_132);
                  if ((char)local_158._M_dataplus._M_p == '\x01') break;
                  if (uVar14 != local_132) {
                    NumToString<unsigned_short>((string *)&local_88,(unsigned_short)uVar14);
                    std::operator+(&local_68,"field id\'s must be consecutive from 0, id ",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_88);
                    plVar9 = (long *)std::__cxx11::string::append((char *)&local_68);
                    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(plVar9 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar9 == paVar13) {
                      local_98._M_allocated_capacity = paVar13->_M_allocated_capacity;
                      local_98._8_8_ = plVar9[3];
                      local_f0._72_8_ = &local_98;
                    }
                    else {
                      local_98._M_allocated_capacity = paVar13->_M_allocated_capacity;
                      local_f0._72_8_ =
                           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)*plVar9;
                    }
                    local_a0 = (pointer)plVar9[1];
                    *plVar9 = (long)paVar13;
                    plVar9[1] = 0;
                    *(undefined1 *)(plVar9 + 2) = 0;
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(local_f0 + 0x20),
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(local_f0 + 0x48),
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_110);
                    plVar9 = (long *)std::__cxx11::string::append(local_f0 + 0x20);
                    psVar12 = (size_type *)(plVar9 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar9 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar12) {
                      local_130.field_2._M_allocated_capacity = *psVar12;
                      local_130.field_2._8_8_ = plVar9[3];
                      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
                    }
                    else {
                      local_130.field_2._M_allocated_capacity = *psVar12;
                      local_130._M_dataplus._M_p = (pointer)*plVar9;
                    }
                    local_130._M_string_length = plVar9[1];
                    *plVar9 = (long)psVar12;
                    plVar9[1] = 0;
                    *(undefined1 *)(plVar9 + 2) = 0;
                    std::operator+(&local_158,&local_130,__rhs);
                    Error(this,(string *)filename);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_158._M_dataplus._M_p != &local_158.field_2) {
                      operator_delete(local_158._M_dataplus._M_p,
                                      local_158.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_130._M_dataplus._M_p != &local_130.field_2) {
                      operator_delete(local_130._M_dataplus._M_p,
                                      local_130.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_f0._32_8_ !=
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(local_f0 + 0x30)) {
                      operator_delete((void *)local_f0._32_8_,local_f0._48_8_ + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_f0._72_8_ != &local_98) {
                      operator_delete((void *)local_f0._72_8_,local_98._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_68._M_dataplus._M_p != &local_68.field_2) {
                      operator_delete(local_68._M_dataplus._M_p,
                                      local_68.field_2._M_allocated_capacity + 1);
                    }
                    local_f0._48_8_ = local_78._M_allocated_capacity;
                    local_f0._32_8_ = local_88._M_allocated_capacity;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_88._M_allocated_capacity != &local_78) goto LAB_00118186;
                    goto LAB_00117b61;
                  }
                  if (uVar14 == 0x7ffe) {
                    __assert_fail("offset < std::numeric_limits<voffset_t>::max()",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flatbuffer_builder.h"
                                  ,0x31,"voffset_t flatbuffers::FieldIndexToOffset(voffset_t)");
                  }
                  (local_110->value).offset = (voffset_t)local_108;
                  uVar14 = uVar14 + 1;
                  ppFVar8 = (name_00->fields).vec.
                            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  uVar10 = (ulong)((int)local_108 + 2);
                  if (((uint)(*(int *)&(name_00->fields).vec.
                                       super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (int)ppFVar8) >>
                       3 & 0xffff) <= (uint)uVar14) goto LAB_00117f18;
                }
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_f0 + 0x20),"field id\'s must be non-negative number, field: ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_110);
                plVar9 = (long *)std::__cxx11::string::append(local_f0 + 0x20);
                psVar12 = (size_type *)(plVar9 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar9 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar12) {
                  local_130.field_2._M_allocated_capacity = *psVar12;
                  local_130.field_2._8_8_ = plVar9[3];
                  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
                }
                else {
                  local_130.field_2._M_allocated_capacity = *psVar12;
                  local_130._M_dataplus._M_p = (pointer)*plVar9;
                }
                local_130._M_string_length = plVar9[1];
                *plVar9 = (long)psVar12;
                plVar9[1] = 0;
                *(undefined1 *)(plVar9 + 2) = 0;
                std::operator+(&local_158,&local_130,__rhs);
                Error(this,(string *)filename);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_158._M_dataplus._M_p != &local_158.field_2) {
                  operator_delete(local_158._M_dataplus._M_p,
                                  local_158.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_130._M_dataplus._M_p != &local_130.field_2) {
                  operator_delete(local_130._M_dataplus._M_p,
                                  local_130.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f0._32_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_f0 + 0x30)) goto LAB_00118186;
              }
              else {
                if (filename[0x67c] == '\x01') {
                  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_158,
                             "all fields must have an \'id\' attribute when --require-explicit-ids is used"
                             ,"");
                  Error(this,(string *)filename);
                }
                else {
                  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_158,
                             "either all fields or no fields must have an \'id\' attribute","");
                  Error(this,(string *)filename);
                }
LAB_0011816f:
                local_f0._48_8_ = local_158.field_2._M_allocated_capacity;
                local_f0._32_8_ = local_158._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_158._M_dataplus._M_p != &local_158.field_2) {
LAB_00118186:
                  operator_delete((void *)local_f0._32_8_,
                                  (ulong)((long)&((_Base_ptr)local_f0._48_8_)->_M_color + 1));
                }
              }
            }
          }
        }
      }
    }
LAB_00117b61:
    if (local_100[0] == (StructDef *)local_f0) goto LAB_001179e7;
  }
  else {
LAB_0011799f:
    local_100[0] = (StructDef *)local_f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"declaration expected","");
    Error(this,(string *)filename);
    if (local_100[0] == (StructDef *)local_f0) goto LAB_001179e7;
  }
  operator_delete(local_100[0],(ulong)(local_f0._0_8_ + 1));
LAB_001179e7:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return SUB82(this,0);
LAB_00117c05:
  ParseField(this,(StructDef *)filename);
  goto LAB_00117bf1;
}

Assistant:

CheckedError Parser::ParseDecl(const char *filename) {
  std::vector<std::string> dc = doc_comment_;
  bool fixed = IsIdent("struct");
  if (!fixed && !IsIdent("table")) return Error("declaration expected");
  NEXT();
  std::string name = attribute_;
  EXPECT(kTokenIdentifier);
  StructDef *struct_def;
  ECHECK(StartStruct(name, &struct_def));
  struct_def->doc_comment = dc;
  struct_def->fixed = fixed;
  if (filename && !opts.project_root.empty()) {
    struct_def->declaration_file =
        &GetPooledString(FilePath(opts.project_root, filename, opts.binary_schema_absolute_paths));
  }
  ECHECK(ParseMetaData(&struct_def->attributes));
  struct_def->sortbysize =
      struct_def->attributes.Lookup("original_order") == nullptr && !fixed;
  EXPECT('{');
  while (token_ != '}') ECHECK(ParseField(*struct_def));
  if (fixed) {
    const auto force_align = struct_def->attributes.Lookup("force_align");
    if (force_align) {
      size_t align;
      ECHECK(ParseAlignAttribute(force_align->constant, struct_def->minalign,
                                 &align));
      struct_def->minalign = align;
    }
    if (!struct_def->bytesize) return Error("size 0 structs not allowed");
  }
  struct_def->PadLastField(struct_def->minalign);
  // Check if this is a table that has manual id assignments
  auto &fields = struct_def->fields.vec;
  if (!fixed && fields.size()) {
    size_t num_id_fields = 0;
    for (auto it = fields.begin(); it != fields.end(); ++it) {
      if ((*it)->attributes.Lookup("id")) num_id_fields++;
    }
    // If any fields have ids..
    if (num_id_fields || opts.require_explicit_ids) {
      // Then all fields must have them.
      if (num_id_fields != fields.size()) {
        if (opts.require_explicit_ids) {
          return Error(
              "all fields must have an 'id' attribute when "
              "--require-explicit-ids is used");
        } else {
          return Error(
              "either all fields or no fields must have an 'id' attribute");
        }
      }
      // Simply sort by id, then the fields are the same as if no ids had
      // been specified.
      std::sort(fields.begin(), fields.end(), compareFieldDefs);
      // Verify we have a contiguous set, and reassign vtable offsets.
      FLATBUFFERS_ASSERT(fields.size() <=
                         flatbuffers::numeric_limits<voffset_t>::max());
      for (voffset_t i = 0; i < static_cast<voffset_t>(fields.size()); i++) {
        auto &field = *fields[i];
        const auto &id_str = field.attributes.Lookup("id")->constant;

        // Metadata values have a dynamic type, they can be `float`, 'int', or
        // 'string`.
        // The FieldIndexToOffset(i) expects the voffset_t so `id` is limited by
        // this type.
        voffset_t id = 0;
        const auto done = !atot(id_str.c_str(), *this, &id).Check();
        if (!done)
          return Error("field id\'s must be non-negative number, field: " +
                       field.name + ", id: " + id_str);
        if (i != id)
          return Error("field id\'s must be consecutive from 0, id " +
                       NumToString(i) + " missing or set twice, field: " +
                       field.name + ", id: " + id_str);
        field.value.offset = FieldIndexToOffset(i);
      }
    }
  }

  ECHECK(
      CheckClash(fields, struct_def, UnionTypeFieldSuffix(), BASE_TYPE_UNION));
  ECHECK(CheckClash(fields, struct_def, "Type", BASE_TYPE_UNION));
  ECHECK(CheckClash(fields, struct_def, "_length", BASE_TYPE_VECTOR));
  ECHECK(CheckClash(fields, struct_def, "Length", BASE_TYPE_VECTOR));
  ECHECK(CheckClash(fields, struct_def, "_byte_vector", BASE_TYPE_STRING));
  ECHECK(CheckClash(fields, struct_def, "ByteVector", BASE_TYPE_STRING));
  EXPECT('}');
  const auto qualified_name =
      current_namespace_->GetFullyQualifiedName(struct_def->name);
  if (types_.Add(qualified_name,
                 new Type(BASE_TYPE_STRUCT, struct_def, nullptr)))
    return Error("datatype already exists: " + qualified_name);
  return NoError();
}